

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

void __thiscall minihttp::HttpSocket::~HttpSocket(HttpSocket *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TcpSocket)._vptr_TcpSocket = (_func_int **)&PTR__HttpSocket_0010dca0;
  Request::~Request(&this->_curRequest);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->_hdrs)._M_t);
  std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>::~deque(&(this->_requestQ).c);
  pcVar2 = (this->_tmpHdr)._M_dataplus._M_p;
  paVar1 = &(this->_tmpHdr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->_accept_encoding)._M_dataplus._M_p;
  paVar1 = &(this->_accept_encoding).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->_user_agent)._M_dataplus._M_p;
  paVar1 = &(this->_user_agent).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  TcpSocket::~TcpSocket(&this->super_TcpSocket);
  return;
}

Assistant:

HttpSocket::~HttpSocket()
{
}